

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.hpp
# Opt level: O1

ostream * test_detail::
          print_range<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,burst::identity_fn>
                    (ostream *stream,long *range)

{
  anon_class_16_2_aa65ec36 __f;
  identity_fn local_11;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"[",1);
  if (*range != range[1]) {
    print_range<std::vector<int,std::allocator<int>>,burst::identity_fn>(stream);
    __f.proj = &local_11;
    __f.stream = stream;
    std::
    for_each<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>const*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>,test_detail::print_range<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,burst::identity_fn>(std::ostream&,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>const&,burst::identity_fn)::_lambda(auto:1_const&)_1_>
              ((vector<int,_std::allocator<int>_> *)(*range + 0x18),
               (vector<int,_std::allocator<int>_> *)range[1],__f);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"]",1);
  return stream;
}

Assistant:

std::ostream & print_range (std::ostream & stream, const Range & range, UnaryFunction proj)
    {
        stream << "[";

        using std::begin;
        using std::end;

        if (begin(range) != end(range))
        {
            stream << proj(*begin(range));
            std::for_each(std::next(begin(range)), end(range),
                [& stream, & proj] (const auto & value)
                {
                    stream << ", " << proj(value);
                });
        }

        return stream << "]";
    }